

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseSerializers.h
# Opt level: O2

void tonk::protocol::handshake::WriteS2CCookieResponse(uint8_t *data,uint64_t cookie)

{
  data[0] = 'k';
  data[1] = 'n';
  data[2] = 'o';
  data[3] = 'T';
  *(uint64_t *)(data + 4) = cookie;
  return;
}

Assistant:

SIAMESE_FORCE_INLINE void WriteU32_LE(uint8_t* data, uint32_t value)
{
#ifdef GF256_ALIGNED_ACCESSES
    data[3] = (uint8_t)(value >> 24);
    data[2] = (uint8_t)(value >> 16);
    data[1] = (uint8_t)(value >> 8);
    data[0] = (uint8_t)value;
#else
    *(uint32_t*)data = value;
#endif
}